

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

void __thiscall
clipp::usage_lines::start_group(usage_lines *this,ostringstream *os,group *group,context *cur)

{
  bool bVar1;
  int iVar2;
  group *pgVar3;
  ulong uVar4;
  size_type sVar5;
  child *pcVar6;
  streamoff sVar7;
  doc_formatting *fmt;
  undefined1 auVar8 [16];
  group *local_498;
  bool local_451;
  string local_448;
  undefined1 local_428 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  surround;
  string local_3e0 [32];
  string local_3c0 [32];
  undefined1 local_3a0 [16];
  string local_390;
  context local_370;
  stringstream local_2a0 [8];
  stringstream buf;
  ulong local_118;
  size_t i;
  string local_108 [32];
  string local_e8 [8];
  __string_type pfx;
  value_type local_c0;
  allocator<char> local_99;
  value_type local_98;
  usage_lines *local_78;
  child_t<clipp::parameter,_clipp::group> *local_70;
  __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
  local_68;
  bool local_5d;
  bool splitAlternatives;
  undefined1 local_50 [8];
  string lbl;
  bool alreadyInside;
  context *cur_local;
  group *group_local;
  ostringstream *os_local;
  usage_lines *this_local;
  
  pgVar3 = clipp::group::depth_first_traverser::parent(&cur->pos);
  lbl.field_2._M_local_buf[0xf] = pgVar3 == group;
  joined_label_abi_cxx11_((string *)local_50,this,group,cur);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::operator<<((ostream *)os,(string *)local_50);
    cur->linestart = false;
    if ((lbl.field_2._M_local_buf[0xf] & 1U) == 0) {
      clipp::group::depth_first_traverser::next_sibling(&cur->pos);
    }
    else {
      clipp::group::depth_first_traverser::next_after_siblings(&cur->pos);
    }
  }
  else {
    bVar1 = clipp::group::exclusive(group);
    local_451 = false;
    if (bVar1) {
      bVar1 = doc_formatting::split_alternatives(&this->fmt_);
      local_451 = false;
      if (bVar1) {
        local_68._M_current = (child_t<clipp::parameter,_clipp::group> *)clipp::group::begin(group);
        local_70 = (child_t<clipp::parameter,_clipp::group> *)clipp::group::end(group);
        local_78 = this;
        local_451 = std::
                    any_of<__gnu_cxx::__normal_iterator<clipp::group::child_t<clipp::parameter,clipp::group>const*,std::vector<clipp::group::child_t<clipp::parameter,clipp::group>,std::allocator<clipp::group::child_t<clipp::parameter,clipp::group>>>>,clipp::usage_lines::start_group(std::__cxx11::ostringstream&,clipp::group_const&,clipp::usage_lines::context&)const::_lambda(clipp::group::child_t<clipp::parameter,clipp::group>const&)_1_>
                              (local_68,(__normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
                                         )local_70,(anon_class_8_1_8991fb9c_for__M_pred)this);
      }
    }
    local_5d = local_451;
    if (local_451 != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
      std::
      stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push(&cur->postfixes,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"",(allocator<char> *)(pfx.field_2._M_local_buf + 0xf));
      std::
      stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push(&cur->separators,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator((allocator<char> *)(pfx.field_2._M_local_buf + 0xf));
      if ((lbl.field_2._M_local_buf[0xf] & 1U) == 0) {
        clipp::group::depth_first_traverser::operator++(&cur->pos);
      }
      cur->linestart = true;
      cur->useOutermost = false;
      std::__cxx11::ostringstream::str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_108,"",(allocator<char> *)((long)&i + 7));
      std::__cxx11::ostringstream::str((string *)os);
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
      local_118 = 0;
      while( true ) {
        sVar5 = clipp::group::size(group);
        if (sVar5 <= local_118) break;
        std::__cxx11::stringstream::stringstream(local_2a0);
        pcVar6 = clipp::group::depth_first_traverser::operator->(&cur->pos);
        bVar1 = clipp::group::child_t<clipp::parameter,_clipp::group>::is_group(pcVar6);
        if (bVar1) {
          pcVar6 = clipp::group::depth_first_traverser::operator->(&cur->pos);
          local_498 = clipp::group::child_t<clipp::parameter,_clipp::group>::as_group(pcVar6);
        }
        else {
          local_498 = (group *)0x0;
        }
        cur->outermost = local_498;
        context::context(&local_370,cur);
        std::__cxx11::string::string((string *)&local_390,local_e8);
        write<std::__cxx11::stringstream>
                  (this,(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_2a0,&local_370,&local_390);
        std::__cxx11::string::~string((string *)&local_390);
        context::~context(&local_370);
        auVar8 = std::ostream::tellp();
        local_3a0 = auVar8;
        sVar7 = std::fpos::operator_cast_to_long((fpos *)local_3a0);
        iVar2 = std::__cxx11::string::size();
        if (iVar2 < sVar7) {
          std::__cxx11::stringstream::str();
          std::operator<<((ostream *)os,local_3c0);
          std::__cxx11::string::~string(local_3c0);
          sVar5 = clipp::group::size(group);
          if (local_118 < sVar5 - 1) {
            if (0 < cur->line) {
              iVar2 = doc_formatting::line_spacing(&this->fmt_);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (local_3e0,(long)iVar2,'\n',
                         (allocator<char> *)(surround.second.field_2._M_local_buf + 0xf));
              std::operator<<((ostream *)os,local_3e0);
              std::__cxx11::string::~string(local_3e0);
              std::allocator<char>::~allocator
                        ((allocator<char> *)(surround.second.field_2._M_local_buf + 0xf));
            }
            cur->line = cur->line + 1;
            std::operator<<((ostream *)os,'\n');
          }
        }
        clipp::group::depth_first_traverser::next_sibling(&cur->pos);
        std::__cxx11::stringstream::~stringstream(local_2a0);
        local_118 = local_118 + 1;
      }
      clipp::group::depth_first_traverser::invalidate(&cur->pos);
      surround.second.field_2._8_4_ = 1;
      std::__cxx11::string::~string(local_e8);
      goto LAB_00128d6b;
    }
    fmt = (doc_formatting *)cur;
    group_surrounders_abi_cxx11_
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_428,this,group,cur);
    std::operator<<((ostream *)os,(string *)local_428);
    std::
    stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push(&cur->postfixes,(value_type *)((long)&surround.first.field_2 + 8));
    group_separator_abi_cxx11_(&local_448,(usage_lines *)group,(group *)&this->fmt_,fmt);
    std::
    stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push(&cur->separators,&local_448);
    std::__cxx11::string::~string((string *)&local_448);
    if ((lbl.field_2._M_local_buf[0xf] & 1U) == 0) {
      clipp::group::depth_first_traverser::operator++(&cur->pos);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_428);
  }
  iVar2 = clipp::group::depth_first_traverser::level(&cur->pos);
  cur->level = iVar2;
  surround.second.field_2._8_4_ = 0;
LAB_00128d6b:
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void start_group(std::ostringstream& os,
                     const group& group, context& cur) const
    {
        //does cur.pos already point to a member or to group itself?
        //needed for special treatment of outermost group
        const bool alreadyInside = &(cur.pos.parent()) == &group;

        auto lbl = joined_label(group, cur);
        if(!lbl.empty()) {
            os << lbl;
            cur.linestart = false;
            //skip over entire group as its label has already been created
            if(alreadyInside) {
                cur.pos.next_after_siblings();
            } else {
                cur.pos.next_sibling();
            }
        }
        else {
            const bool splitAlternatives = group.exclusive() &&
                fmt_.split_alternatives() &&
                std::any_of(group.begin(), group.end(),
                    [this](const pattern& p) {
                        return int(p.param_count()) >= fmt_.alternatives_min_split_size();
                    });

            if(splitAlternatives) {
                cur.postfixes.push("");
                cur.separators.push("");
                //recursively print alternative paths in decision-DAG
                //enter group?
                if(!alreadyInside) ++cur.pos;
                cur.linestart = true;
                cur.useOutermost = false;
                auto pfx = os.str();
                os.str("");
                //print paths in DAG starting at each group member
                for(std::size_t i = 0; i < group.size(); ++i) {
                    std::stringstream buf;
                    cur.outermost = cur.pos->is_group() ? &(cur.pos->as_group()) : nullptr;
                    write(buf, cur, pfx);
                    if(buf.tellp() > int(pfx.size())) {
                        os << buf.str();
                        if(i < group.size()-1) {
                            if(cur.line > 0) {
                                os << string(fmt_.line_spacing(), '\n');
                            }
                            ++cur.line;
                            os << '\n';
                        }
                    }
                    cur.pos.next_sibling(); //do not descend into members
                }
                cur.pos.invalidate(); //signal end-of-path
                return;
            }
            else {
                //pre & postfixes, separators
                auto surround = group_surrounders(group, cur);
                os << surround.first;
                cur.postfixes.push(std::move(surround.second));
                cur.separators.push(group_separator(group, fmt_));
                //descend into group?
                if(!alreadyInside) ++cur.pos;
            }
        }
        cur.level = cur.pos.level();
    }